

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O2

bool __thiscall GdlGlyphClassDefn::IncludesGlyph(GdlGlyphClassDefn *this,utf16 w)

{
  pointer ppGVar1;
  GdlGlyphClassMember *pGVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    ppGVar1 = (this->m_vpglfdMembers).
              super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->m_vpglfdMembers).
                  super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3;
    if (uVar6 <= uVar5) break;
    pGVar2 = ppGVar1[uVar5];
    iVar4 = (*(pGVar2->super_GdlDefn)._vptr_GdlDefn[0xd])(pGVar2,w);
    uVar3 = uVar5 + 1;
  } while ((char)iVar4 == '\0');
  return uVar5 < uVar6;
}

Assistant:

bool GdlGlyphClassDefn::IncludesGlyph(utf16 w)
{
	for (size_t iglfd = 0; iglfd < m_vpglfdMembers.size(); iglfd++)
	{
		if (m_vpglfdMembers[iglfd]->IncludesGlyph(w))
			return true;
	}
	return false;
}